

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

unsigned_long __thiscall gimage::Histogram::sumAll(Histogram *this)

{
  unsigned_long uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  
  uVar4 = 0;
  uVar2 = (ulong)*(uint *)this;
  if ((int)*(uint *)this < 1) {
    uVar2 = uVar4;
  }
  uVar3 = (ulong)*(uint *)(this + 4);
  if ((int)*(uint *)(this + 4) < 1) {
    uVar3 = uVar4;
  }
  uVar1 = 0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = uVar1 + *(long *)(*(long *)(*(long *)(this + 0x18) + uVar4 * 8) + uVar5 * 8);
    }
  }
  return uVar1;
}

Assistant:

unsigned long Histogram::sumAll() const
{
  unsigned long ret=0;

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      ret+=row[k][i];
    }
  }

  return ret;
}